

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShParser.cpp
# Opt level: O2

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
parseDirectiveShImportObj(Parser *parser,int flags)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *source;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *source_00;
  undefined4 in_register_00000034;
  undefined1 local_90 [8];
  Identifier ctorName;
  vector<Expression,_std::allocator<Expression>_> list;
  Identifier local_48;
  StringLiteral inputName;
  
  list.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  list.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  list.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bVar1 = Parser::parseExpressionList((Parser *)CONCAT44(in_register_00000034,flags),&list,1,2);
  if (bVar1) {
    inputName._value._M_dataplus._M_p = (pointer)&inputName._value.field_2;
    inputName._value._M_string_length = 0;
    inputName._value.field_2._M_local_buf[0] = '\0';
    bVar1 = Expression::evaluateString
                      (list.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
                       super__Vector_impl_data._M_start,&inputName,true);
    if (bVar1) {
      if ((long)list.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)list.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
                super__Vector_impl_data._M_start == 0x30) {
        ctorName._name._M_dataplus._M_p = (pointer)&ctorName._name.field_2;
        ctorName._name._M_string_length = 0;
        ctorName._name.field_2._M_local_buf[0] = '\0';
        bVar1 = Expression::evaluateIdentifier
                          (list.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
                           super__Vector_impl_data._M_start + 1,&ctorName);
        if (bVar1) {
          ghc::filesystem::u8path<std::__cxx11::string,ghc::filesystem::path>
                    ((path *)&local_48,(filesystem *)&inputName,source_00);
          std::make_unique<DirectiveObjImport,ghc::filesystem::path,Identifier&>
                    ((path *)local_90,&local_48);
          (parser->entries).
          super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_90;
          local_90 = (undefined1  [8])0x0;
          ghc::filesystem::path::~path((path *)&local_48);
        }
        else {
          (parser->entries).
          super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
        }
        std::__cxx11::string::~string((string *)&ctorName);
      }
      else {
        ghc::filesystem::u8path<std::__cxx11::string,ghc::filesystem::path>
                  ((path *)&ctorName,(filesystem *)&inputName,source);
        std::make_unique<DirectiveObjImport,ghc::filesystem::path>((path *)&local_48);
        (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)local_48._name._M_dataplus._M_p;
        local_48._name._M_dataplus._M_p = (pointer)0x0;
        ghc::filesystem::path::~path((path *)&ctorName);
      }
    }
    else {
      (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    }
    std::__cxx11::string::~string((string *)&inputName);
  }
  else {
    (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  }
  std::vector<Expression,_std::allocator<Expression>_>::~vector(&list);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> parseDirectiveShImportObj(Parser& parser, int flags)
{
	std::vector<Expression> list;
	if (!parser.parseExpressionList(list,1,2))
		return nullptr;

	StringLiteral inputName;
	if (!list[0].evaluateString(inputName,true))
		return nullptr;
	
	if (list.size() == 2)
	{
		Identifier ctorName;
		if (!list[1].evaluateIdentifier(ctorName))
			return nullptr;
		
		return std::make_unique<DirectiveObjImport>(inputName.path(),ctorName);
	}

	return std::make_unique<DirectiveObjImport>(inputName.path());
}